

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O2

void TTD::NSSnapObjects::AssertSnapEquiv_SnapArrayInfoCore<void*>
               (SnapArrayInfoBlock<void_*> *arrayInfo1,SnapArrayInfoBlock<void_*> *arrayInfo2,
               TTDCompareMap *compareMap)

{
  SnapArrayInfoBlock<void_*> **segment;
  uint32 *pos;
  SnapArrayInfoBlock<void_*> **index;
  SnapArrayInfoBlock<void_*> *local_50;
  SnapArrayInfoBlock<void_*> *arrayInfo1_local;
  SnapArrayInfoBlock<void_*> *arrayInfo2_local;
  uint32 index2;
  uint32 pos2;
  uint32 index1;
  uint32 pos1;
  
  arrayInfo2_local._0_4_ = 0;
  index2 = 0;
  if (arrayInfo1 != (SnapArrayInfoBlock<void_*> *)0x0) {
    index2 = arrayInfo1->FirstIndex;
  }
  pos2 = 0;
  if (arrayInfo2 != (SnapArrayInfoBlock<void_*> *)0x0) {
    arrayInfo2_local._0_4_ = arrayInfo2->FirstIndex;
  }
  arrayInfo2_local._4_4_ = 0;
  local_50 = arrayInfo1;
  arrayInfo1_local = arrayInfo2;
  while ((local_50 != (SnapArrayInfoBlock<void_*> *)0x0 &&
         (arrayInfo1_local != (SnapArrayInfoBlock<void_*> *)0x0))) {
    if (index2 < (uint32)arrayInfo2_local) {
      TTDCompareMap::DiagnosticAssert(compareMap,local_50->ArrayValidTags[pos2] == '\0');
      segment = &local_50;
      pos = &pos2;
      index = (SnapArrayInfoBlock<void_*> **)&index2;
    }
    else {
      if ((uint32)arrayInfo2_local < index2) {
        TTDCompareMap::DiagnosticAssert
                  (compareMap,arrayInfo1_local->ArrayValidTags[arrayInfo2_local._4_4_] == '\0');
      }
      else {
        TTDCompareMap::DiagnosticAssert
                  (compareMap,
                   local_50->ArrayValidTags[pos2] ==
                   arrayInfo1_local->ArrayValidTags[arrayInfo2_local._4_4_]);
        if (local_50->ArrayValidTags[pos2] != '\0') {
          SnapArrayInfo_EquivValue
                    (local_50->ArrayRangeContents[pos2],
                     arrayInfo1_local->ArrayRangeContents[arrayInfo2_local._4_4_],compareMap,index2)
          ;
        }
        AdvanceArrayIndex_SnapArrayInfoCompare<void*>(&index2,&pos2,&local_50);
      }
      index = &arrayInfo2_local;
      segment = &arrayInfo1_local;
      pos = (uint32 *)((long)&arrayInfo2_local + 4);
    }
    AdvanceArrayIndex_SnapArrayInfoCompare<void*>((uint32 *)index,pos,segment);
  }
  while (local_50 != (SnapArrayInfoBlock<void_*> *)0x0) {
    TTDCompareMap::DiagnosticAssert(compareMap,local_50->ArrayValidTags[pos2] == '\0');
    AdvanceArrayIndex_SnapArrayInfoCompare<void*>(&index2,&pos2,&local_50);
  }
  return;
}

Assistant:

void AssertSnapEquiv_SnapArrayInfoCore(const SnapArrayInfoBlock<T>* arrayInfo1, const SnapArrayInfoBlock<T>* arrayInfo2, TTDCompareMap& compareMap)
        {
            uint32 index1 = (arrayInfo1 != nullptr) ? arrayInfo1->FirstIndex : 0;
            uint32 pos1 = 0;

            uint32 index2 = (arrayInfo2 != nullptr) ? arrayInfo2->FirstIndex : 0;
            uint32 pos2 = 0;

            while(arrayInfo1 != nullptr && arrayInfo2 != nullptr)
            {
                if(index1 < index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                }
                else if(index1 > index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
                else
                {
                    compareMap.DiagnosticAssert(arrayInfo1->ArrayValidTags[pos1] == arrayInfo2->ArrayValidTags[pos2]);
                    if(arrayInfo1->ArrayValidTags[pos1])
                    {
                        SnapArrayInfo_EquivValue(arrayInfo1->ArrayRangeContents[pos1], arrayInfo2->ArrayRangeContents[pos2], compareMap, index1);
                    }

                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
            }

            //make sure any remaining entries an empty
            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
            }

            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
            }
        }